

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountFailureRepr.cpp
# Opt level: O2

string * __thiscall
CountFailureRepr::asString_abi_cxx11_(string *__return_storage_ptr__,CountFailureRepr *this)

{
  size_t __val;
  
  __val = oout::CountFailure::count
                    ((this->count).
                     super___shared_ptr<const_oout::CountFailure,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    );
  std::__cxx11::to_string(__return_storage_ptr__,__val);
  return __return_storage_ptr__;
}

Assistant:

string CountFailureRepr::asString() const
{
	return to_string(count->count());
}